

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

int32_t lj_ffrecord_select_mode(jit_State *J,TRef tr,TValue *tv)

{
  undefined2 uVar1;
  TRef TVar2;
  uint *in_RDX;
  uint in_ESI;
  GCobj *in_RDI;
  int32_t start;
  TRef trchar;
  TRef trptr;
  undefined8 in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  undefined2 in_stack_ffffffffffffff76;
  jit_State *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff84;
  undefined2 in_stack_ffffffffffffff86;
  undefined2 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 local_44;
  
  if (((in_ESI & 0x1f000000) == 0x4000000) && (*(char *)((ulong)*in_RDX + 0x10) == '#')) {
    uVar1 = (undefined2)in_ESI;
    if (*(int *)((ulong)*in_RDX + 0xc) == 1) {
      TVar2 = lj_ir_kgc((jit_State *)
                        CONCAT44(in_stack_ffffffffffffff94,CONCAT22(uVar1,in_stack_ffffffffffffff90)
                                ),in_RDI,
                        CONCAT22(in_stack_ffffffffffffff86,in_stack_ffffffffffffff84));
      *(undefined2 *)((long)in_RDI + 0xa4) = 0x884;
      *(undefined2 *)((long)in_RDI + 0xa0) = uVar1;
      *(short *)((long)in_RDI + 0xa2) = (short)TVar2;
      lj_opt_fold(in_stack_ffffffffffffff78);
    }
    else {
      TVar2 = lj_ir_kint((jit_State *)
                         CONCAT26(in_stack_ffffffffffffff86,
                                  CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)),
                         (int32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      *(undefined2 *)((long)in_RDI + 0xa4) = 0x3f05;
      *(undefined2 *)((long)in_RDI + 0xa0) = uVar1;
      *(short *)((long)in_RDI + 0xa2) = (short)TVar2;
      TVar2 = lj_opt_fold(in_stack_ffffffffffffff78);
      *(undefined2 *)((long)in_RDI + 0xa4) = 0x4510;
      *(short *)((long)in_RDI + 0xa0) = (short)TVar2;
      *(undefined2 *)((long)in_RDI + 0xa2) = 1;
      TVar2 = lj_opt_fold(in_stack_ffffffffffffff78);
      uVar1 = (undefined2)TVar2;
      TVar2 = lj_ir_kint((jit_State *)
                         CONCAT26(uVar1,CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80
                                                )),(int32_t)((ulong)in_RDI >> 0x20));
      *(undefined2 *)((long)in_RDI + 0xa4) = 0x893;
      *(undefined2 *)((long)in_RDI + 0xa0) = uVar1;
      *(short *)((long)in_RDI + 0xa2) = (short)TVar2;
      lj_opt_fold((jit_State *)&in_RDI->gch);
    }
    local_44 = 0;
  }
  else {
    local_44 = argv2int(in_stack_ffffffffffffff78,
                        (TValue *)CONCAT26(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70));
    if (local_44 == 0) {
      lj_trace_err((jit_State *)CONCAT26(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70),
                   (TraceError)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    }
  }
  return local_44;
}

Assistant:

int32_t lj_ffrecord_select_mode(jit_State *J, TRef tr, TValue *tv)
{
  if (tref_isstr(tr) && *strVdata(tv) == '#') {  /* select('#', ...) */
    if (strV(tv)->len == 1) {
      emitir(IRTG(IR_EQ, IRT_STR), tr, lj_ir_kstr(J, strV(tv)));
    } else {
      TRef trptr = emitir(IRT(IR_STRREF, IRT_PGC), tr, lj_ir_kint(J, 0));
      TRef trchar = emitir(IRT(IR_XLOAD, IRT_U8), trptr, IRXLOAD_READONLY);
      emitir(IRTG(IR_EQ, IRT_INT), trchar, lj_ir_kint(J, '#'));
    }
    return 0;
  } else {  /* select(n, ...) */
    int32_t start = argv2int(J, tv);
    if (start == 0) lj_trace_err(J, LJ_TRERR_BADTYPE);  /* A bit misleading. */
    return start;
  }
}